

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1522.c
# Opt level: O1

int sockopt_callback(void *clientp,curl_socket_t curlfd,curlsocktype purpose)

{
  int sndbufsize;
  undefined1 local_4 [4];
  
  setsockopt(curlfd,1,7,local_4,4);
  return 0;
}

Assistant:

static int sockopt_callback(void *clientp, curl_socket_t curlfd,
                            curlsocktype purpose)
{
#if defined(SOL_SOCKET) && defined(SO_SNDBUF)
  int sndbufsize = 4 * 1024; /* 4KB send buffer */
  (void) clientp;
  (void) purpose;
  setsockopt(curlfd, SOL_SOCKET, SO_SNDBUF,
             (const char *)&sndbufsize, sizeof(sndbufsize));
#else
  (void)clientp;
  (void)curlfd;
  (void)purpose;
#endif
  return CURL_SOCKOPT_OK;
}